

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.cc
# Opt level: O2

void __thiscall
testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
Matcher(Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,char *s)

{
  allocator<char> local_69;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).vtable_ = (VTable *)0x0;
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0027a7e8;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,s,&local_69);
  std::__cxx11::string::string((string *)&local_30,&local_50);
  Matcher<std::__cxx11::string>::Matcher<testing::internal::EqMatcher<std::__cxx11::string>,void>
            ((Matcher<std::__cxx11::string> *)&local_68,&local_30);
  internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator=(&this->
             super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ,&local_68);
  internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&local_68);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

Matcher<std::string>::Matcher(const char* s) { *this = Eq(std::string(s)); }